

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionObject.cpp
# Opt level: O1

void __thiscall btCollisionObject::btCollisionObject(btCollisionObject *this)

{
  btMatrix3x3 *pbVar1;
  btVector3 *pbVar2;
  
  this->_vptr_btCollisionObject = (_func_int **)&PTR__btCollisionObject_00223800;
  (this->m_anisotropicFriction).m_floats[0] = 1.0;
  (this->m_anisotropicFriction).m_floats[1] = 1.0;
  (this->m_anisotropicFriction).m_floats[2] = 1.0;
  (this->m_anisotropicFriction).m_floats[3] = 0.0;
  this->m_hasAnisotropicFriction = 0;
  this->m_contactProcessingThreshold = 1e+18;
  this->m_broadphaseHandle = (btBroadphaseProxy *)0x0;
  this->m_collisionShape = (btCollisionShape *)0x0;
  this->m_extensionPointer = (void *)0x0;
  this->m_rootCollisionShape = (btCollisionShape *)0x0;
  this->m_collisionFlags = 1;
  this->m_islandTag1 = -1;
  this->m_companionId = -1;
  this->m_activationState1 = 1;
  this->m_deactivationTime = 0.0;
  this->m_friction = 0.5;
  this->m_restitution = 0.0;
  this->m_rollingFriction = 0.0;
  this->m_internalType = 1;
  this->m_userObjectPointer = (void *)0x0;
  this->m_userIndex = -1;
  this->m_hitFraction = 1.0;
  this->m_ccdSweptSphereRadius = 0.0;
  this->m_ccdMotionThreshold = 0.0;
  this->m_checkCollideWith = 0;
  (this->m_objectsWithoutCollisionCheck).m_ownsMemory = true;
  (this->m_objectsWithoutCollisionCheck).m_data = (btCollisionObject **)0x0;
  (this->m_objectsWithoutCollisionCheck).m_size = 0;
  (this->m_objectsWithoutCollisionCheck).m_capacity = 0;
  this->m_updateRevision = 0;
  (this->m_worldTransform).m_basis.m_el[0].m_floats[0] = 1.0;
  pbVar1 = &(this->m_worldTransform).m_basis;
  pbVar1->m_el[0].m_floats[1] = 0.0;
  pbVar1->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_worldTransform).m_basis.m_el[0].m_floats + 3) = 0;
  (this->m_worldTransform).m_basis.m_el[1].m_floats[1] = 1.0;
  pbVar2 = (this->m_worldTransform).m_basis.m_el;
  pbVar2[1].m_floats[2] = 0.0;
  pbVar2[1].m_floats[3] = 0.0;
  pbVar1 = &(this->m_worldTransform).m_basis;
  pbVar1->m_el[2].m_floats[0] = 0.0;
  pbVar1->m_el[2].m_floats[1] = 0.0;
  (this->m_worldTransform).m_basis.m_el[2].m_floats[2] = 1.0;
  (this->m_worldTransform).m_origin.m_floats[3] = 0.0;
  *(undefined8 *)((this->m_worldTransform).m_basis.m_el[2].m_floats + 3) = 0;
  (this->m_worldTransform).m_origin.m_floats[1] = 0.0;
  (this->m_worldTransform).m_origin.m_floats[2] = 0.0;
  return;
}

Assistant:

btCollisionObject::btCollisionObject()
	:	m_anisotropicFriction(1.f,1.f,1.f),
	m_hasAnisotropicFriction(false),
	m_contactProcessingThreshold(BT_LARGE_FLOAT),
		m_broadphaseHandle(0),
		m_collisionShape(0),
		m_extensionPointer(0),
		m_rootCollisionShape(0),
		m_collisionFlags(btCollisionObject::CF_STATIC_OBJECT),
		m_islandTag1(-1),
		m_companionId(-1),
		m_activationState1(1),
		m_deactivationTime(btScalar(0.)),
		m_friction(btScalar(0.5)),
		m_restitution(btScalar(0.)),
		m_rollingFriction(0.0f),
		m_internalType(CO_COLLISION_OBJECT),
		m_userObjectPointer(0),
		m_userIndex(-1),
		m_hitFraction(btScalar(1.)),
		m_ccdSweptSphereRadius(btScalar(0.)),
		m_ccdMotionThreshold(btScalar(0.)),
		m_checkCollideWith(false),
		m_updateRevision(0)
{
	m_worldTransform.setIdentity();
}